

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_36::HttpClientAdapter::WebSocketResponseImpl::~WebSocketResponseImpl
          (WebSocketResponseImpl *this)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&this->task);
  Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>,_std::nullptr_t>::dispose
            (&this->fulfiller);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

WebSocketResponseImpl(kj::Own<kj::PromiseFulfiller<HttpClient::WebSocketResponse>> fulfiller)
        : fulfiller(kj::mv(fulfiller)) {}